

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O2

int Super_CompareGates(Super_Man_t *pMan,uint *uTruth,float Area,float *tPinDelaysRes,int nPins)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Super_Gate_t_conflict *pSVar6;
  Super_Gate_t_conflict *pSVar7;
  Super_Gate_t_conflict **ppSVar8;
  int *piVar9;
  bool bVar10;
  bool bVar11;
  Super_Gate_t_conflict *pSVar12;
  Super_Gate_t_conflict *pEntry;
  Super_Gate_t_conflict *pSVar13;
  Super_Gate_t_conflict *pSVar14;
  uint uVar15;
  double dVar16;
  Super_Gate_t_conflict **ppList;
  int *local_48;
  double local_40;
  double local_38;
  
  uVar15 = *uTruth;
  if (pMan->nVarsMax < 6) {
    if (uVar15 + 1 < 2) {
      return 0;
    }
  }
  else if (uVar15 == 0xffffffff) {
    if (uTruth[1] == 0xffffffff) {
      return 0;
    }
    uVar15 = 0xffffffff;
  }
  else if ((uVar15 == 0) && (uVar15 = 0, uTruth[1] == 0)) {
    return 0;
  }
  iVar5 = stmm_find(pMan->tTable,(char *)(ulong)(uVar15 ^ uTruth[1]),(char ***)&ppList);
  if (iVar5 != 0) {
    pEntry = *ppList;
    if (pEntry == (Super_Gate_t_conflict *)0x0) {
      pSVar6 = (Super_Gate_t_conflict *)0x0;
    }
    else {
      pSVar6 = pEntry->pNext;
    }
    dVar16 = (double)Area;
    local_38 = dVar16 + 0.001;
    pSVar12 = (Super_Gate_t_conflict *)(ulong)(uint)nPins;
    if (nPins < 1) {
      pSVar12 = (Super_Gate_t_conflict *)0x0;
    }
    local_48 = &pMan->nRemoved;
    pSVar13 = (Super_Gate_t_conflict *)0x0;
    local_40 = dVar16;
    while (pSVar7 = pSVar6, pEntry != (Super_Gate_t_conflict *)0x0) {
      pMan->nLookups = pMan->nLookups + 1;
      piVar9 = &pMan->nAliases;
      if ((pEntry->uTruth[0] == *uTruth) && (pEntry->uTruth[1] == uTruth[1])) {
        bVar3 = false;
        bVar10 = true;
        if (dVar16 <= (double)pEntry->Area + 0.001) {
          bVar10 = false;
          if ((double)pEntry->Area <= local_38) {
            bVar3 = false;
          }
          else {
            bVar3 = true;
          }
        }
        for (pSVar6 = (Super_Gate_t_conflict *)0x0; bVar11 = bVar10, bVar4 = bVar3,
            pSVar12 != pSVar6; pSVar6 = (Super_Gate_t_conflict *)((long)&pSVar6->pRoot + 1)) {
          fVar1 = pEntry->ptDelays[(long)pSVar6];
          if ((fVar1 != -9999.0) || (NAN(fVar1))) {
            fVar2 = tPinDelaysRes[(long)pSVar6];
            if ((fVar2 != -9999.0) || (NAN(fVar2))) {
              if (fVar2 <= fVar1 + 0.001) {
                if (fVar2 + 0.001 < fVar1) {
                  bVar3 = true;
                }
              }
              else {
                bVar10 = true;
              }
              bVar11 = true;
              bVar4 = true;
              if (bVar10 && bVar3) break;
            }
          }
        }
        pSVar14 = pEntry;
        if (!bVar11 || !bVar4) {
          if (!bVar4) {
            return 0;
          }
          ppSVar8 = ppList;
          if (pSVar13 != (Super_Gate_t_conflict *)0x0) {
            ppSVar8 = &pSVar13->pNext;
          }
          *ppSVar8 = pEntry->pNext;
          Extra_MmFixedEntryRecycle(pMan->pMem,(char *)pEntry);
          piVar9 = local_48;
          dVar16 = local_40;
          goto LAB_0030cbe3;
        }
      }
      else {
LAB_0030cbe3:
        *piVar9 = *piVar9 + 1;
        pSVar14 = pSVar13;
      }
      pSVar6 = (Super_Gate_t_conflict *)0x0;
      pEntry = pSVar7;
      pSVar13 = pSVar14;
      if (pSVar7 != (Super_Gate_t_conflict *)0x0) {
        pSVar6 = pSVar7->pNext;
      }
    }
  }
  return 1;
}

Assistant:

int Super_CompareGates( Super_Man_t * pMan, unsigned uTruth[], float Area, float tPinDelaysRes[], int nPins )
{
    Super_Gate_t ** ppList, * pPrev, * pGate, * pGate2;
    int i, fNewIsBetter, fGateIsBetter;
    ABC_PTRUINT_T Key;

    // skip constant functions
    if ( pMan->nVarsMax < 6 )
    {
        if ( uTruth[0] == 0 || ~uTruth[0] == 0 )
            return 0;
    }
    else
    {
        if ( ( uTruth[0] == 0 && uTruth[1] == 0 ) || ( ~uTruth[0] == 0 && ~uTruth[1] == 0 ) )
            return 0;
    }

    // get hold of the place where the entry is stored
//    Key = uTruth[0] + 2003 * uTruth[1];
    Key = uTruth[0] ^ uTruth[1];
    if ( !stmm_find( pMan->tTable, (char *)Key, (char ***)&ppList ) )
        return 1; 
    // the entry with this truth table is found
    pPrev = NULL;
    for ( pGate = *ppList, pGate2 = pGate? pGate->pNext: NULL; pGate; 
        pGate = pGate2, pGate2 = pGate? pGate->pNext: NULL )
    {
        pMan->nLookups++;
        if ( pGate->uTruth[0] != uTruth[0] || pGate->uTruth[1] != uTruth[1] )
        {
            pMan->nAliases++;
            continue;
        }
        fGateIsBetter = 0;
        fNewIsBetter  = 0;
        if ( pGate->Area + SUPER_EPSILON < Area )
            fGateIsBetter = 1;
        else if ( pGate->Area > Area + SUPER_EPSILON )
            fNewIsBetter = 1;
        for ( i = 0; i < nPins; i++ )
        {
            if ( pGate->ptDelays[i] == SUPER_NO_VAR || tPinDelaysRes[i] == SUPER_NO_VAR )
                continue;
            if ( pGate->ptDelays[i] + SUPER_EPSILON < tPinDelaysRes[i] )
                fGateIsBetter = 1;
            else if ( pGate->ptDelays[i] > tPinDelaysRes[i] + SUPER_EPSILON )
                fNewIsBetter = 1;
            if ( fGateIsBetter && fNewIsBetter )
                break;
        }
        // consider 4 cases
        if ( fGateIsBetter && fNewIsBetter ) // Pareto points; save both
            pPrev = pGate;
        else if ( fNewIsBetter ) // gate is worse; remove the gate
        {
            if ( pPrev == NULL )
                *ppList = pGate->pNext;
            else
                pPrev->pNext = pGate->pNext;
            Extra_MmFixedEntryRecycle( pMan->pMem, (char *)pGate );
            pMan->nRemoved++;
        }
        else if ( fGateIsBetter ) // new is worse, already dominated no need to see others
            return 0;
        else // if ( !fGateIsBetter && !fNewIsBetter ) // they are identical, no need to see others
            return 0;
    }
    return 1;
}